

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.cpp
# Opt level: O1

ChVector<double> *
chrono::Quat_to_Angle
          (ChVector<double> *__return_storage_ptr__,AngleSet angset,ChQuaternion<double> *mquat)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  char cVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  double dVar26;
  ChMatrix33<double> Acoord;
  double local_88;
  ChMatrix33<double> local_58;
  
  __return_storage_ptr__->m_data[0] = 0.0;
  __return_storage_ptr__->m_data[1] = 0.0;
  __return_storage_ptr__->m_data[2] = 0.0;
  ChMatrix33<double>::ChMatrix33(&local_58,mquat);
  switch(angset) {
  case EULERO:
    dVar26 = acos(local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[8]);
    dVar12 = sin(dVar26);
    dVar12 = acos(local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[7] / dVar12);
    auVar13._8_8_ = 0;
    auVar13._0_8_ =
         local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar6._8_8_ = 0x8000000000000000;
    auVar6._0_8_ = 0x8000000000000000;
    auVar9 = vxorpd_avx512vl(auVar13,auVar6);
    dVar25 = sin(dVar26);
    local_88 = auVar9._0_8_;
    dVar25 = acos(local_88 / dVar25);
    dVar25 = (double)((ulong)(dVar26 != 0.0) * (long)dVar25);
    dVar12 = (double)((ulong)(dVar26 != 0.0) * (long)dVar12);
    break;
  case CARDANO:
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[7];
    auVar9 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar1);
    auVar9 = vmaxsd_avx(ZEXT816(0xbff0000000000000),auVar9);
    dVar26 = asin(auVar9._0_8_);
    dVar12 = cos(dVar26);
    auVar20._0_8_ =
         local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] /
         dVar12;
    auVar20._8_8_ = 0;
    auVar9 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar20);
    auVar9 = vmaxsd_avx(ZEXT816(0xbff0000000000000),auVar9);
    dVar12 = cos(dVar26);
    auVar21._0_8_ =
         local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] /
         dVar12;
    auVar21._8_8_ = 0;
    auVar23 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar21);
    auVar23 = vmaxsd_avx(ZEXT816(0xbff0000000000000),auVar23);
    dVar12 = acos(auVar9._0_8_);
    dVar25 = acos(auVar23._0_8_);
    break;
  case HPB:
    auVar14._8_8_ = 0;
    auVar14._0_8_ =
         local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar5._8_8_ = 0x8000000000000000;
    auVar5._0_8_ = 0x8000000000000000;
    auVar9 = vxorpd_avx512vl(auVar14,auVar5);
    uVar2 = vcmpsd_avx512f(auVar14,ZEXT816(0xbff0000000000000),1);
    bVar3 = (bool)((byte)uVar2 & 1);
    auVar8._0_8_ = (ulong)bVar3 * 0x3ff0000000000000 + (ulong)!bVar3 * auVar9._0_8_;
    auVar8._8_8_ = auVar9._8_8_;
    auVar9 = vmaxsd_avx(ZEXT816(0xbff0000000000000),auVar8);
    dVar26 = asin(auVar9._0_8_);
    dVar12 = cos(dVar26);
    auVar15._0_8_ =
         local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] /
         dVar12;
    auVar15._8_8_ = 0;
    auVar9 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar15);
    auVar9 = vmaxsd_avx(ZEXT816(0xbff0000000000000),auVar9);
    dVar12 = cos(dVar26);
    auVar16._0_8_ =
         local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] /
         dVar12;
    auVar16._8_8_ = 0;
    auVar23 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar16);
    auVar23 = vmaxsd_avx(ZEXT816(0xbff0000000000000),auVar23);
    dVar25 = acos(auVar9._0_8_);
    dVar12 = acos(auVar23._0_8_);
    break;
  case RXYZ:
    auVar17._8_8_ = 0;
    auVar17._0_8_ =
         local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar4._8_8_ = 0x8000000000000000;
    auVar4._0_8_ = 0x8000000000000000;
    auVar9 = vxorpd_avx512vl(auVar17,auVar4);
    uVar2 = vcmpsd_avx512f(auVar17,ZEXT816(0xbff0000000000000),1);
    bVar3 = (bool)((byte)uVar2 & 1);
    auVar10._0_8_ = (ulong)bVar3 * 0x3ff0000000000000 + (ulong)!bVar3 * auVar9._0_8_;
    auVar10._8_8_ = auVar9._8_8_;
    auVar9 = vmaxsd_avx(ZEXT816(0xbff0000000000000),auVar10);
    dVar26 = asin(auVar9._0_8_);
    dVar12 = cos(dVar26);
    auVar18._0_8_ =
         local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] /
         dVar12;
    auVar18._8_8_ = 0;
    auVar9 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar18);
    auVar9 = vmaxsd_avx(ZEXT816(0xbff0000000000000),auVar9);
    dVar12 = cos(dVar26);
    auVar19._0_8_ =
         local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] /
         dVar12;
    auVar19._8_8_ = 0;
    auVar23 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar19);
    auVar23 = vmaxsd_avx(ZEXT816(0xbff0000000000000),auVar23);
    dVar12 = asin(auVar9._0_8_);
    dVar25 = asin(auVar23._0_8_);
    break;
  case RODRIGUEZ:
    dVar12 = local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
             + local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4] + local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[8];
    if (0.0 <= dVar12) {
      dVar12 = dVar12 + 1.0;
      if (dVar12 < 0.0) {
        dVar12 = sqrt(dVar12);
      }
      else {
        auVar9._8_8_ = 0;
        auVar9._0_8_ = dVar12;
        auVar9 = vsqrtsd_avx(auVar9,auVar9);
        dVar12 = auVar9._0_8_;
      }
      dVar11 = dVar12 * 0.5;
      dVar12 = 0.5 / dVar12;
      dVar25 = (local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [7] - local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array[5]) * dVar12;
      dVar26 = (local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [2] - local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array[6]) * dVar12;
      dVar12 = (local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [3] - local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array[1]) * dVar12;
    }
    else {
      cVar7 = local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
              < local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [4];
      dVar12 = local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [0];
      if ((bool)cVar7) {
        dVar12 = local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
      }
      if (dVar12 < local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[8]) {
        cVar7 = '\x02';
      }
      if (cVar7 == '\x02') {
        dVar12 = ((local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[8] -
                  local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[0]) -
                 local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4]) + 1.0;
        if (dVar12 < 0.0) {
          dVar11 = sqrt(dVar12);
        }
        else {
          auVar23._8_8_ = 0;
          auVar23._0_8_ = dVar12;
          auVar9 = vsqrtsd_avx(auVar23,auVar23);
          dVar11 = auVar9._0_8_;
        }
        dVar12 = dVar11 * 0.5;
        dVar11 = 0.5 / dVar11;
        dVar25 = (local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[6] +
                 local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2]) * dVar11;
        dVar26 = (local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[5] +
                 local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7]) * dVar11;
        local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
             local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3]
             - local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [1];
      }
      else if (cVar7 == '\x01') {
        dVar12 = ((local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[4] -
                  local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[8]) -
                 local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0]) + 1.0;
        if (dVar12 < 0.0) {
          dVar11 = sqrt(dVar12);
        }
        else {
          auVar22._8_8_ = 0;
          auVar22._0_8_ = dVar12;
          auVar9 = vsqrtsd_avx(auVar22,auVar22);
          dVar11 = auVar9._0_8_;
        }
        dVar26 = dVar11 * 0.5;
        dVar11 = 0.5 / dVar11;
        dVar12 = (local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[5] +
                 local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7]) * dVar11;
        dVar25 = (local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[1] +
                 local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3]) * dVar11;
        local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
             local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2]
             - local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [6];
      }
      else {
        dVar12 = ((local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0] -
                  local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[4]) -
                 local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8]) + 1.0;
        if (dVar12 < 0.0) {
          dVar11 = sqrt(dVar12);
        }
        else {
          auVar24._8_8_ = 0;
          auVar24._0_8_ = dVar12;
          auVar9 = vsqrtsd_avx(auVar24,auVar24);
          dVar11 = auVar9._0_8_;
        }
        dVar25 = dVar11 * 0.5;
        dVar11 = 0.5 / dVar11;
        dVar26 = (local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[1] +
                 local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3]) * dVar11;
        dVar12 = (local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[6] +
                 local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2]) * dVar11;
        local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
             local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7]
             - local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [5];
      }
      dVar11 = local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [2] * dVar11;
    }
    dVar12 = dVar12 / dVar11;
    dVar26 = dVar26 / dVar11;
    dVar25 = dVar25 / dVar11;
    break;
  default:
    goto switchD_004f3b2a_default;
  }
  __return_storage_ptr__->m_data[0] = dVar25;
  __return_storage_ptr__->m_data[1] = dVar26;
  __return_storage_ptr__->m_data[2] = dVar12;
switchD_004f3b2a_default:
  return __return_storage_ptr__;
}

Assistant:

ChVector<double> Quat_to_Angle(AngleSet angset, const ChQuaternion<double>& mquat) {
    ChVector<double> res;
    ChMatrix33<> Acoord(mquat);

    switch (angset) {
        case AngleSet::EULERO:
            res = Acoord.Get_A_Eulero();
            break;
        case AngleSet::CARDANO:
            res = Acoord.Get_A_Cardano();
            break;
        case AngleSet::HPB:
            res = Acoord.Get_A_Hpb();
            break;
        case AngleSet::RXYZ:
            res = Acoord.Get_A_Rxyz();
            break;
        case AngleSet::RODRIGUEZ:
            res = Acoord.Get_A_Rodriguez();
            break;
        default:
            break;
    }
    return res;
}